

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::peer_connection::second_tick(peer_connection *this,int tick_interval_ms)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  session_settings *psVar5;
  session_interface *psVar6;
  torrent_peer *ptVar7;
  undefined1 auVar8 [16];
  _WordT _Var9;
  undefined8 this_00;
  bool bVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  piece_index_t new_piece;
  int iVar14;
  int iVar15;
  alert_manager *paVar16;
  long lVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  const_iterator __end1;
  long lVar19;
  ulong uVar20;
  element_type *peVar21;
  bool bVar22;
  shared_ptr<libtorrent::peer_connection> me;
  torrent *local_90;
  undefined1 local_88 [8];
  error_category *local_80;
  duration local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  int local_64;
  undefined1 local_60 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_80 = (error_category *)local_88;
  local_78.__r = (rep)aux::time_now();
  std::__shared_ptr<libtorrent::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::peer_connection,void>
            ((__shared_ptr<libtorrent::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
             (local_60 + 0x20),
             (__weak_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::peer_connection>);
  local_70 = (this->super_peer_connection_hot_members).m_torrent.
             super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar14 = local_70->_M_use_count;
    do {
      if (iVar14 == 0) {
        local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar15 = local_70->_M_use_count;
      bVar22 = iVar14 == iVar15;
      if (bVar22) {
        local_70->_M_use_count = iVar14 + 1;
        iVar15 = iVar14;
      }
      iVar14 = iVar15;
      UNLOCK();
    } while (!bVar22);
  }
  if (local_70 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar22 = true;
  }
  else {
    bVar22 = local_70->_M_use_count == 0;
  }
  if (bVar22) {
    local_90 = (torrent *)0x0;
  }
  else {
    local_90 = (this->super_peer_connection_hot_members).m_torrent.
               super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  psVar5 = (this->super_peer_connection_hot_members).m_settings;
  local_80._0_1_ = 0;
  local_88 = (undefined1  [8])&psVar5->m_mutex;
  local_64 = tick_interval_ms;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
  local_80._0_1_ = true;
  _Var9 = (psVar5->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
  uVar13 = 0;
  if ((((uint)_Var9 >> 0x10 & 1) != 0) && (local_90 != (torrent *)0x0)) {
    psVar6 = (this->super_peer_connection_hot_members).m_ses;
    uVar12 = (*(psVar6->super_session_logger)._vptr_session_logger[0x34])
                       (psVar6,&(this->super_peer_connection_hot_members).field_0x2c,
                        (ulong)(uint)(this->m_statistics).m_stat[5].m_counter,
                        (ulong)(uint)(this->m_statistics).m_stat[4].m_counter);
    psVar6 = (this->super_peer_connection_hot_members).m_ses;
    uVar13 = (*(psVar6->super_session_logger)._vptr_session_logger[0x34])
                       (psVar6,&local_90->super_peer_class_set,
                        (ulong)(uint)(this->m_statistics).m_stat[5].m_counter,
                        (ulong)(uint)(this->m_statistics).m_stat[4].m_counter);
    uVar13 = uVar13 | uVar12;
  }
  local_60._24_8_ = this;
  if ((uVar13 != 0) &&
     (paVar16 = torrent::alerts(local_90), ((paVar16->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
    uVar12 = 0;
    do {
      if ((uVar13 >> (uVar12 & 0x1f) & 1) != 0) {
        paVar16 = torrent::alerts(local_90);
        torrent::get_handle((torrent *)local_60);
        local_88._0_4_ = uVar12 == 1 | 2;
        alert_manager::
        emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                  (paVar16,(torrent_handle *)local_60,(performance_warning_t *)local_88);
        if ((piece_picker *)local_60._8_8_ != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                    super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar14 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar14 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                     super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                     ).
                                     super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
            *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                            super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                            ).
                            super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar14 + -1;
          }
          if (iVar14 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                      super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 == 1);
  }
  this_00 = local_60._24_8_;
  if ((local_90 == (torrent *)0x0) ||
     ((*(byte *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0x30))->
                 _vptr__Sp_counted_base & 1) != 0)) {
    if (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0x30))->
                _vptr__Sp_counted_base & 2) != 0) {
      counters::inc_stats_counter
                (*(counters **)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0xe0))->
                   _M_use_count,0xe4,-1);
      if ((local_90 != (torrent *)0x0) &&
         (ptVar7 = (torrent_peer *)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xe0))->
                   _vptr__Sp_counted_base,
         local_90->m_num_connecting = local_90->m_num_connecting - 1,
         (ptVar7->field_0x1b & 0x80) != 0)) {
        local_90->m_num_connecting_seeds = local_90->m_num_connecting_seeds - 1;
      }
      *(byte *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                _vptr__Sp_counted_base =
           *(byte *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                     _vptr__Sp_counted_base & 0xfd;
    }
    _local_88 = errors::make_error_code(torrent_aborted);
    (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x14])(this_00,local_88,1,0);
  }
  else {
    if (((((~*(byte *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0x30))->
                       _vptr__Sp_counted_base & 0x14) == 0) &&
         ((((vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0xb0))->
            _vptr__Sp_counted_base)->
          super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>)
          ._M_impl.super__Vector_impl_data._M_start ==
          *(pointer *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0xb0))->_M_use_count
         )) && ((((vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0x130))->
                  _M_use_count)->
                super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                )._M_impl.super__Vector_impl_data._M_start ==
                (pointer)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0x140))
                         ->_vptr__Sp_counted_base)) &&
       ((((time_point *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0x220))->_M_use_count)
        ->__d).__r <= local_78.__r + -5000000000)) {
      (((time_point *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._24_8_ + 0x220))->_M_use_count)->
      __d).__r = local_78.__r;
      bVar22 = request_a_block(local_90,(peer_connection *)local_60._24_8_);
      if (bVar22) {
        counters::inc_stats_counter
                  (*(counters **)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xe0))->
                     _M_use_count,0x1f,1);
      }
      if (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                  _vptr__Sp_counted_base & 1) != 0) goto LAB_001fd4bf;
      send_block_requests((peer_connection *)this_00);
    }
    if ((((local_90->field_0x5b0 & 8) != 0) &&
        (((local_90->super_torrent_hot_members).field_0x3b & 2) != 0)) &&
       ((((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x760))->
                 _vptr__Sp_counted_base & 0x1000000) == 0 &&
        ((((time_point *)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x270))->_M_use_count)->__d).
         __r + 10000000000 < local_78.__r)))) {
      new_piece = torrent::get_piece_to_super_seed
                            (local_90,(typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                                       *)(this_00 + 8));
      superseed_piece((peer_connection *)this_00,(piece_index_t)0xffffffff,new_piece);
    }
    (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x2f])(this_00);
    iVar14 = (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[1])(this_00);
    if ((char)iVar14 == '\0') {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x1f0);
      p_Var18 = p_Var3;
      while (p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                          *)&p_Var18->_vptr__Sp_counted_base)->_M_impl)._M_node.
                       super__List_node_base._M_next, p_Var18 != p_Var3) {
        (*(code *)((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base)->_M_next[0xf]._M_next)();
      }
      iVar14 = (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[1])(this_00);
      if ((char)iVar14 == '\0') {
        lVar19 = local_78.__r -
                 ((duration *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x250))->
                  _vptr__Sp_counted_base)->__r;
        if (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                    _vptr__Sp_counted_base & 2) != 0) {
          psVar5 = *(session_settings **)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))->
                     _M_use_count;
          local_80._0_1_ = 0;
          local_88 = (undefined1  [8])&psVar5->m_mutex;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
          local_80._0_1_ = true;
          iVar14 = (psVar5->m_store).m_ints._M_elems[0x11];
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
          if ((torrent_peer *)
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xe0))->
              _vptr__Sp_counted_base != (torrent_peer *)0x0) {
            iVar14 = (*(uint *)&((torrent_peer *)
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xe0))->
                                _vptr__Sp_counted_base)->field_0x1b & 0x1f) * 3 + iVar14;
          }
          bVar22 = aux::is_ssl(((__shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                                 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    (this_00 + 0xa0))->_vptr__Sp_counted_base)->_M_ptr);
          bVar10 = aux::is_i2p(((__shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                                 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    (this_00 + 0xa0))->_vptr__Sp_counted_base)->_M_ptr);
          iVar15 = iVar14 + 10;
          if (!bVar22) {
            iVar15 = iVar14;
          }
          iVar14 = iVar15 + 0x14;
          if (!bVar10) {
            iVar14 = iVar15;
          }
          if ((long)iVar14 * 1000000000 < lVar19) {
            _local_88 = errors::make_error_code(timed_out);
            p_Var18 = p_Var3;
            do {
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        p_Var18->_vptr__Sp_counted_base;
              if (p_Var18 == p_Var3) goto LAB_001fdca0;
              cVar11 = (*(code *)((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base)->_M_next
                                 [0xc]._M_prev)
                                 ((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base,local_88);
            } while (cVar11 != '\0');
            if (p_Var18 == p_Var3) {
LAB_001fdca0:
              peer_log((peer_connection *)this_00,info,"CONNECT_FAILED","waited %d seconds",
                       (ulong)(uint)((int)(SUB168(SEXT816(lVar19) * SEXT816(0x112e0be826d694b3),8)
                                          >> 0x1a) -
                                    (SUB164(SEXT816(lVar19) * SEXT816(0x112e0be826d694b3),0xc) >>
                                    0x1f)));
              _local_88 = errors::make_error_code(timed_out);
              connect_failed((peer_connection *)this_00,(error_code *)local_88);
              goto LAB_001fd4bf;
            }
          }
        }
        bVar4 = ((bandwidth_state_flags_t *)
                ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xf0))->
                        _vptr__Sp_counted_base + 5))->m_val;
        if ((bVar4 & 4) != 0) {
          iVar14 = (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x33])(this_00);
          if ((((long)iVar14 * 1000000000 < lVar19) &&
              (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                       _vptr__Sp_counted_base & 2) == 0)) &&
             (*(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x730))->
                       _vptr__Sp_counted_base == 0)) {
            _local_88 = errors::make_error_code(timed_out_inactivity);
            p_Var18 = p_Var3;
            do {
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        p_Var18->_vptr__Sp_counted_base;
              if (p_Var18 == p_Var3) goto LAB_001fdcfe;
              cVar11 = (*(code *)((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base)->_M_next
                                 [0xc]._M_prev)
                                 ((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base,local_88);
            } while (cVar11 != '\0');
            if (p_Var18 == p_Var3) {
LAB_001fdcfe:
              peer_log((peer_connection *)this_00,info,"LAST_ACTIVITY","%d seconds ago",
                       (ulong)(uint)((int)(SUB168(SEXT816(lVar19) * SEXT816(0x112e0be826d694b3),8)
                                          >> 0x1a) -
                                    (SUB164(SEXT816(lVar19) * SEXT816(0x112e0be826d694b3),0xc) >>
                                    0x1f)));
              _local_88 = errors::make_error_code(timed_out_inactivity);
              (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x14])(this_00,local_88,1,0);
              goto LAB_001fd4bf;
            }
          }
        }
        psVar5 = *(session_settings **)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))->_M_use_count;
        local_80._0_1_ = 0;
        local_88 = (undefined1  [8])&psVar5->m_mutex;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
        local_80._0_1_ = true;
        iVar14 = (psVar5->m_store).m_ints._M_elems[0x1b];
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
        bVar22 = aux::is_i2p(((__shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                               *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xa0))
                                  ->_vptr__Sp_counted_base)->_M_ptr);
        if (((((bVar4 & 4) == 0) ||
             (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                      _vptr__Sp_counted_base & 2) != 0)) ||
            (iVar15 = (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x1b])(this_00),
            (char)iVar15 == '\0')) || (lVar19 <= (long)(iVar14 << bVar22 * '\x02') * 1000000000)) {
          lVar19 = ((duration *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x230))->
                    _vptr__Sp_counted_base)->__r;
          lVar17 = (((time_point *)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x230))->
                     _M_use_count)->__d).__r;
          if (lVar19 < lVar17) {
            lVar19 = lVar17;
          }
          lVar17 = ((duration *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x260))->
                    _vptr__Sp_counted_base)->__r;
          if (lVar19 <= lVar17) {
            lVar19 = lVar17;
          }
          if (((((bVar4 & 4) != 0) &&
               (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                        _vptr__Sp_counted_base & 2) == 0)) &&
              ((((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                        _vptr__Sp_counted_base & 0x20) == 0 &&
               ((*(pointer *)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xc0))->_M_use_count
                 == (pointer)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xd0))->
                             _vptr__Sp_counted_base &&
                (*(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x730))->
                          _vptr__Sp_counted_base == 0)))))) &&
             (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x760))->
                      _vptr__Sp_counted_base & 0x1000000) != 0)) {
            bVar22 = torrent::is_finished(local_90);
            if ((bVar22 || (*(ulong *)&(local_90->super_torrent_hot_members).field_0x38 & 0x81000000
                           ) != 0) && (uVar20 = local_78.__r - lVar19, 60000000000 < (long)uVar20))
            {
              _local_88 = errors::make_error_code(timed_out_no_request);
              p_Var18 = p_Var3;
              do {
                p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          p_Var18->_vptr__Sp_counted_base;
                if (p_Var18 == p_Var3) goto LAB_001fddfb;
                cVar11 = (*(code *)((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base)->_M_next
                                   [0xc]._M_prev)
                                   ((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base,local_88);
              } while (cVar11 != '\0');
              if (p_Var18 == p_Var3) {
LAB_001fddfb:
                peer_log((peer_connection *)this_00,info,"NO_REQUEST","waited %d seconds",
                         uVar20 / 1000000000);
                _local_88 = errors::make_error_code(timed_out_no_request);
                (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x14])(this_00,local_88,1,0)
                ;
                goto LAB_001fd4bf;
              }
            }
          }
          lVar19 = local_78.__r -
                   (((time_point *)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x270))->
                     _M_use_count)->__d).__r;
          peVar21 = (element_type *)
                    (local_78.__r -
                    ((duration *)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x280))->
                     _vptr__Sp_counted_base)->__r);
          psVar5 = *(session_settings **)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))->
                     _M_use_count;
          local_80._0_1_ = 0;
          local_88 = (undefined1  [8])&psVar5->m_mutex;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
          local_80._0_1_ = true;
          iVar14 = (psVar5->m_store).m_ints._M_elems[0x13];
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
          if ((((bVar4 & 4) != 0) &&
              (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x30))->
                       _vptr__Sp_counted_base & 0x10) == 0)) &&
             (lVar17 = (long)iVar14 * 1000000000,
             (lVar17 < (long)peVar21 &
             lVar17 < lVar19 &
             ~*(byte *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x760))->
                               _vptr__Sp_counted_base + 3)) == 1)) {
            local_60._16_8_ = peVar21;
            iVar14 = (*(((session_interface *)
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))->
                        _vptr__Sp_counted_base)->super_session_logger)._vptr_session_logger[0x1e])()
            ;
            iVar15 = aux::session_settings::get_int
                               (*(session_settings **)
                                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))
                                  ->_M_use_count,0x4055);
            if ((iVar15 <= iVar14) ||
               ((int)((uint)((ulong)*(undefined8 *)&(local_90->super_torrent_hot_members).field_0x38
                            >> 0x21) & 0xffffff) <=
                (int)((ulong)((long)(local_90->super_torrent_hot_members).m_connections.
                                    super_vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                    .
                                    super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_90->super_torrent_hot_members).m_connections.
                                   super_vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                   .
                                   super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                (int)((ulong)((long)(local_90->m_peers_to_disconnect).
                                    super__Vector_base<std::shared_ptr<libtorrent::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::peer_connection>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_90->m_peers_to_disconnect).
                                   super__Vector_base<std::shared_ptr<libtorrent::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::peer_connection>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
              _local_88 = errors::make_error_code(timed_out_no_interest);
              p_Var18 = p_Var3;
              do {
                p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          p_Var18->_vptr__Sp_counted_base;
                if (p_Var18 == p_Var3) goto LAB_001fdd68;
                cVar11 = (*(code *)((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base)->_M_next
                                   [0xc]._M_prev)
                                   ((_List_node_base *)p_Var18[1]._vptr__Sp_counted_base,local_88);
              } while (cVar11 != '\0');
              if (p_Var18 == p_Var3) {
LAB_001fdd68:
                iVar14 = (*(((session_interface *)
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))->
                            _vptr__Sp_counted_base)->super_session_logger)._vptr_session_logger[5])
                                   ();
                if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar14) + 0x68) < 0) {
                  auVar8 = SEXT816(lVar19) * SEXT816(0x112e0be826d694b3);
                  peer_log((peer_connection *)this_00,info,"MUTUAL_NO_INTEREST","t1: %d t2: %d",
                           (ulong)(uint)((int)(auVar8._8_8_ >> 0x1a) - (auVar8._12_4_ >> 0x1f)),
                           (ulong)(uint)((int)(SUB168(SEXT816((long)local_60._16_8_) *
                                                      SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                                        (SUB164(SEXT816((long)local_60._16_8_) *
                                                SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)));
                }
                _local_88 = errors::make_error_code(timed_out_no_interest);
                (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x14])(this_00,local_88,1,0)
                ;
                goto LAB_001fd4bf;
              }
            }
          }
          if ((((bVar4 & 4) != 0) &&
              ((((vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xb0))->
                 _vptr__Sp_counted_base)->
               super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
               )._M_impl.super__Vector_impl_data._M_start !=
               *(pointer *)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xb0))->_M_use_count))
             && ((0 < *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      (this_00 + 0x130))->_vptr__Sp_counted_base + 4) &&
                 (iVar14 = request_timeout((peer_connection *)this_00),
                 (long)iVar14 * 1000000000 +
                 (((time_point *)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x260))->_M_use_count
                  )->__d).__r < local_78.__r)))) {
            snub_peer((peer_connection *)this_00);
          }
          keep_alive((peer_connection *)this_00);
          bVar4 = *(byte *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   (this_00 + 0x760))->_vptr__Sp_counted_base + 3);
          if (((((bVar4 & 0x10) != 0) &&
               (((ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x760))->
                        _vptr__Sp_counted_base & 0x400000) == 0)) &&
              (0 < *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x2a0))->
                            _vptr__Sp_counted_base)) &&
             (*(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x6f0))->
                       _vptr__Sp_counted_base <=
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x2a0))->
                       _vptr__Sp_counted_base + 5000)) {
            *(byte *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x760))->
                             _vptr__Sp_counted_base + 3) = bVar4 & 0xef;
            iVar14 = (*(((session_interface *)
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))->
                        _vptr__Sp_counted_base)->super_session_logger)._vptr_session_logger[5])();
            if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar14) + 0x68) < 0) {
              peer_log((peer_connection *)this_00,info,"SLOW_START",
                       "exit slow start: prev-dl: %d dl: %d",
                       (ulong)*(uint *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        (this_00 + 0x2a0))->_vptr__Sp_counted_base,
                       (ulong)*(uint *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        (this_00 + 0x6f0))->_vptr__Sp_counted_base);
            }
          }
          iVar14 = local_64;
          *(int32_t *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x2a0))->
            _vptr__Sp_counted_base =
               *(int32_t *)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x6f0))->
                 _vptr__Sp_counted_base;
          *(int32_t *)
           ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x2a0))->
                   _vptr__Sp_counted_base + 4) =
               *(int32_t *)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x6d0))->
                 _vptr__Sp_counted_base;
          lVar19 = 0x6c8;
          do {
            stat_channel::second_tick
                      ((stat_channel *)
                       ((long)&((bandwidth_socket *)this_00)->_vptr_bandwidth_socket + lVar19),
                       iVar14);
            lVar19 = lVar19 + 0x10;
          } while (lVar19 != 0x728);
          iVar14 = *(int32_t *)
                    ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x6d0))->
                            _vptr__Sp_counted_base + 4);
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x740))->_M_weak_count <
              iVar14) {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x740))->_M_weak_count =
                 iVar14;
          }
          iVar14 = *(int32_t *)
                    ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x6f0))->
                            _vptr__Sp_counted_base + 4);
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x740))->_M_use_count <
              iVar14) {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x740))->_M_use_count =
                 iVar14;
          }
          iVar14 = (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[1])(this_00);
          if (((char)iVar14 == '\0') &&
             (((local_90->super_torrent_hot_members).field_0x3b & 2) != 0)) {
            update_desired_queue_size((peer_connection *)this_00);
            if ((*(uint *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x150))->
                           _vptr__Sp_counted_base ==
                 (uint)*(ushort *)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x750))->
                         _M_use_count) &&
               (paVar16 = torrent::alerts(local_90),
               ((paVar16->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
              paVar16 = torrent::alerts(local_90);
              torrent::get_handle((torrent *)local_60);
              local_88._0_4_ = 1;
              alert_manager::
              emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                        (paVar16,(torrent_handle *)local_60,(performance_warning_t *)local_88);
              if ((piece_picker *)local_60._8_8_ != (piece_picker *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var2 = (_Atomic_word *)(local_60._8_8_ + 0xc);
                  iVar14 = *p_Var2;
                  *p_Var2 = *p_Var2 + -1;
                  UNLOCK();
                }
                else {
                  iVar14 = *(_Atomic_word *)(local_60._8_8_ + 0xc);
                  *(int *)(local_60._8_8_ + 0xc) = iVar14 + -1;
                }
                if (iVar14 == 1) {
                  (*(code *)(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                            super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                            ).
                            super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_start[3])();
                }
              }
            }
            iVar14 = aux::session_settings::get_int
                               (*(session_settings **)
                                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))
                                  ->_M_use_count,0x4004);
            if ((((((vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *
                    )&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xb0))->
                      _vptr__Sp_counted_base)->
                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                  )._M_impl.super__Vector_impl_data._M_start !=
                  *(pointer *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0xb0))->_M_use_count
                 ) && (0 < *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           (this_00 + 0x130))->_vptr__Sp_counted_base + 4))) &&
               ((long)iVar14 * 1000000000 <
                local_78.__r -
                ((duration *)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x220))->
                 _vptr__Sp_counted_base)->__r)) {
              iVar15 = (*(((session_interface *)
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x20))->
                          _vptr__Sp_counted_base)->super_session_logger)._vptr_session_logger[5])();
              if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar15) + 0x68) < 0) {
                auVar8 = SEXT816(local_78.__r -
                                 ((duration *)
                                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x220)
                                  )->_vptr__Sp_counted_base)->__r) * SEXT816(0x112e0be826d694b3);
                peer_log((peer_connection *)this_00,info,"PIECE_REQUEST_TIMED_OUT",
                         "%d time: %d to: %d",
                         (ulong)(uint)((int)((ulong)((long)*(pointer *)
                                                            &((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  (this_00 + 0xb0))->_M_use_count -
                                                  (long)(((
                                                  vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)(this_00 + 0xb0))->_vptr__Sp_counted_base)
                                                  ->
                                                  super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                      * -0x55555555),
                         (ulong)(uint)((int)(auVar8._8_8_ >> 0x1a) - (auVar8._12_4_ >> 0x1f)),iVar14
                        );
              }
              snub_peer((peer_connection *)this_00);
            }
            fill_send_buffer((peer_connection *)this_00);
          }
        }
        else {
          peer_log((peer_connection *)this_00,info,"NO_HANDSHAKE","waited %d seconds",
                   (ulong)(uint)((int)(SUB168(SEXT816(lVar19) * SEXT816(0x112e0be826d694b3),8) >>
                                      0x1a) -
                                (SUB164(SEXT816(lVar19) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f))
                  );
          _local_88 = errors::make_error_code(timed_out_no_handshake);
          (*((bandwidth_socket *)this_00)->_vptr_bandwidth_socket[0x14])(this_00,local_88,1,0);
        }
      }
    }
  }
LAB_001fd4bf:
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void peer_connection::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(is_single_thread());
		time_point const now = aux::time_now();
		std::shared_ptr<peer_connection> me(self());

		// the invariant check must be run before me is destructed
		// in case the peer got disconnected
		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = m_torrent.lock();

		int warning = 0;
		// drain the IP overhead from the bandwidth limiters
		if (m_settings.get_bool(settings_pack::rate_limit_ip_overhead) && t)
		{
			warning |= m_ses.use_quota_overhead(*this, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
			warning |= m_ses.use_quota_overhead(*t, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
		}

		if (warning && t->alerts().should_post<performance_alert>())
		{
			for (int channel = 0; channel < 2; ++channel)
			{
				if ((warning & (1 << channel)) == 0) continue;
				t->alerts().emplace_alert<performance_alert>(t->get_handle()
					, channel == peer_connection::download_channel
					? performance_alert::download_limit_too_low
					: performance_alert::upload_limit_too_low);
			}
		}

		if (!t || m_disconnecting)
		{
			TORRENT_ASSERT(t || !m_connecting);
			if (m_connecting)
			{
				m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
				if (t) t->dec_num_connecting(m_peer_info);
				m_connecting = false;
			}
			disconnect(errors::torrent_aborted, operation_t::bittorrent);
			return;
		}

		if (m_endgame_mode
			&& m_interesting
			&& m_download_queue.empty()
			&& m_request_queue.empty()
			&& now - seconds(5) >= m_last_request)
		{
			// this happens when we're in strict end-game
			// mode and the peer could not request any blocks
			// because they were all taken but there were still
			// unrequested blocks. Now, 5 seconds later, there
			// might not be any unrequested blocks anymore, so
			// we should try to pick another block to see
			// if we can pick a busy one
			m_last_request = now;
			if (request_a_block(*t, *this))
				m_counters.inc_stats_counter(counters::end_game_piece_picks);
			if (m_disconnecting) return;
			send_block_requests();
		}

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& t->ready_for_connections()
			&& !m_peer_interested
			&& m_became_uninterested + seconds(10) < now)
		{
			// maybe we need to try another piece, to see if the peer
			// become interested in us then
			superseed_piece(piece_index_t(-1), t->get_piece_to_super_seed(m_have_piece));
		}
#endif

		on_tick();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->tick();
		}
		if (is_disconnecting()) return;
#endif

		// if the peer hasn't said a thing for a certain
		// time, it is considered to have timed out
		time_duration d = now - m_last_receive;

		if (m_connecting)
		{
			int connect_timeout = m_settings.get_int(settings_pack::peer_connect_timeout);
			if (m_peer_info) connect_timeout += 3 * m_peer_info->failcount;

			// SSL and i2p handshakes are slow
			if (is_ssl(*m_socket))
				connect_timeout += 10;

#if TORRENT_USE_I2P
			if (is_i2p(*m_socket))
				connect_timeout += 20;
#endif

			if (d > seconds(connect_timeout)
				&& can_disconnect(errors::timed_out))
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CONNECT_FAILED", "waited %d seconds"
					, int(total_seconds(d)));
#endif
				connect_failed(errors::timed_out);
				return;
			}
		}

		// if we can't read, it means we're blocked on the rate-limiter
		// or the disk, not the peer itself. In this case, don't blame
		// the peer and disconnect it
		bool const may_timeout = bool(m_channel_state[download_channel] & peer_info::bw_network);

		// TODO: 2 use a deadline_timer for timeouts. Don't rely on second_tick()!
		// Hook this up to connect timeout as well. This would improve performance
		// because of less work in second_tick(), and might let use remove ticking
		// entirely eventually
		if (may_timeout && d > seconds(timeout()) && !m_connecting && m_reading_bytes == 0
			&& can_disconnect(errors::timed_out_inactivity))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "LAST_ACTIVITY", "%d seconds ago"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_inactivity, operation_t::bittorrent);
			return;
		}

		// do not stall waiting for a handshake
		int timeout = m_settings.get_int (settings_pack::handshake_timeout);
#if TORRENT_USE_I2P
		timeout *= is_i2p(*m_socket) ? 4 : 1;
#endif
		if (may_timeout
			&& !m_connecting
			&& in_handshake()
			&& d > seconds(timeout))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_HANDSHAKE", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_handshake, operation_t::bittorrent);
			return;
		}

		// disconnect peers that we unchoked, but they didn't send a request in
		// the last 60 seconds, and we haven't been working on servicing a request
		// for more than 60 seconds.
		// but only if we're a seed
		d = now - std::max(std::max(m_last_unchoke, m_last_incoming_request)
			, m_last_sent_payload);

		if (may_timeout
			&& !m_connecting
			&& m_requests.empty()
			&& m_reading_bytes == 0
			&& !m_choked
			&& m_peer_interested
			&& t && t->is_upload_only()
			&& d > seconds(60)
			&& can_disconnect(errors::timed_out_no_request))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_REQUEST", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_request, operation_t::bittorrent);
			return;
		}

		// if the peer hasn't become interested and we haven't
		// become interested in the peer for 10 minutes, it
		// has also timed out.
		time_duration const d1 = now - m_became_uninterested;
		time_duration const d2 = now - m_became_uninteresting;
		time_duration const time_limit = seconds(
			m_settings.get_int(settings_pack::inactivity_timeout));

		// don't bother disconnect peers we haven't been interested
		// in (and that hasn't been interested in us) for a while
		// unless we have used up all our connection slots
		if (may_timeout
			&& !m_interesting
			&& !m_peer_interested
			&& d1 > time_limit
			&& d2 > time_limit
			&& (m_ses.num_connections() >= m_settings.get_int(settings_pack::connections_limit)
				|| (t && t->num_peers() >= t->max_connections()))
			&& can_disconnect(errors::timed_out_no_interest))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "MUTUAL_NO_INTEREST", "t1: %d t2: %d"
					, int(total_seconds(d1)), int(total_seconds(d2)));
			}
#endif
			disconnect(errors::timed_out_no_interest, operation_t::bittorrent);
			return;
		}

		if (may_timeout
			&& !m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now > m_requested + seconds(request_timeout()))
		{
			snub_peer();
		}

		// if we haven't sent something in too long, send a keep-alive
		keep_alive();

		// if our download rate isn't increasing significantly anymore, end slow
		// start. The 10kB is to have some slack here.
		// we can't do this when we're choked, because we aren't sending any
		// requests yet, so there hasn't been an opportunity to ramp up the
		// connection yet.
		if (m_slow_start
			&& !m_peer_choked
			&& m_downloaded_last_second > 0
			&& m_downloaded_last_second + 5000
				>= m_statistics.last_payload_downloaded())
		{
			m_slow_start = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "SLOW_START", "exit slow start: "
					"prev-dl: %d dl: %d"
					, int(m_downloaded_last_second)
					, m_statistics.last_payload_downloaded());
			}
#endif
		}
		m_downloaded_last_second = m_statistics.last_payload_downloaded();
		m_uploaded_last_second = m_statistics.last_payload_uploaded();

		m_statistics.second_tick(tick_interval_ms);

		if (m_statistics.upload_payload_rate() > m_upload_rate_peak)
		{
			m_upload_rate_peak = m_statistics.upload_payload_rate();
		}
		if (m_statistics.download_payload_rate() > m_download_rate_peak)
		{
			m_download_rate_peak = m_statistics.download_payload_rate();
		}
		if (is_disconnecting()) return;

		if (!t->ready_for_connections()) return;

		update_desired_queue_size();

		if (m_desired_queue_size == m_max_out_request_queue
			&& t->alerts().should_post<performance_alert>())
		{
			t->alerts().emplace_alert<performance_alert>(t->get_handle()
				, performance_alert::outstanding_request_limit_reached);
		}

		int const piece_timeout = m_settings.get_int(settings_pack::piece_timeout);

		if (!m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now - m_last_piece > seconds(piece_timeout))
		{
			// this peer isn't sending the pieces we've
			// requested (this has been observed by BitComet)
			// in this case we'll clear our download queue and
			// re-request the blocks.
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "PIECE_REQUEST_TIMED_OUT"
					, "%d time: %d to: %d"
					, int(m_download_queue.size()), int(total_seconds(now - m_last_piece))
					, piece_timeout);
			}
#endif

			snub_peer();
		}

		fill_send_buffer();
	}